

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SetCurrentWindow(ImGuiWindow_conflict *window)

{
  uint uVar1;
  ImGuiContext_conflict1 *pIVar2;
  ImGuiContext_conflict1 *g;
  ImGuiTable *pIVar3;
  float fVar4;
  
  pIVar2 = GImGui;
  GImGui->CurrentWindow = window;
  if (window == (ImGuiWindow_conflict *)0x0) {
    pIVar2->CurrentTable = (ImGuiTable *)0x0;
    return;
  }
  uVar1 = (window->DC).CurrentTableIdx;
  if ((ulong)uVar1 == 0xffffffff) {
    pIVar3 = (ImGuiTable *)0x0;
  }
  else {
    if (((int)uVar1 < 0) || ((pIVar2->Tables).Buf.Size <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                    ,0x706,"T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]");
    }
    pIVar3 = (pIVar2->Tables).Buf.Data + uVar1;
  }
  pIVar2->CurrentTable = pIVar3;
  fVar4 = pIVar2->FontBaseSize * window->FontWindowScale * window->FontDpiScale;
  if (window->ParentWindow != (ImGuiWindow_conflict *)0x0) {
    fVar4 = fVar4 * window->ParentWindow->FontWindowScale;
  }
  (pIVar2->DrawListSharedData).FontSize = fVar4;
  pIVar2->FontSize = fVar4;
  return;
}

Assistant:

static void SetCurrentWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow = window;
    g.CurrentTable = window && window->DC.CurrentTableIdx != -1 ? g.Tables.GetByIndex(window->DC.CurrentTableIdx) : NULL;
    if (window)
        g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
}